

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<double,_QVariant>_>::insert
          (QMovableArrayOps<std::pair<double,_QVariant>_> *this,qsizetype i,qsizetype n,
          parameter_type t)

{
  pair<double,_QVariant> **pppVar1;
  qsizetype *pqVar2;
  long in_FS_OFFSET;
  bool bVar3;
  Inserter IStack_88;
  undefined1 local_60 [40];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_60._0_8_ = -NAN;
  local_60._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_60._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_60._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_60._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  std::pair<double,_QVariant>::pair((pair<double,_QVariant> *)local_60,t);
  bVar3 = (this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
          super_QArrayDataPointer<std::pair<double,_QVariant>_>.size != 0;
  QArrayDataPointer<std::pair<double,_QVariant>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<double,_QVariant>_> *)this,(uint)(i == 0 && bVar3),n,
             (pair<double,_QVariant> **)0x0,(QArrayDataPointer<std::pair<double,_QVariant>_> *)0x0);
  if (i == 0 && bVar3) {
    while (bVar3 = n != 0, n = n + -1, bVar3) {
      std::pair<double,_QVariant>::pair
                ((this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
                 super_QArrayDataPointer<std::pair<double,_QVariant>_>.ptr + -1,
                 (pair<double,_QVariant> *)local_60);
      pppVar1 = &(this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
                 super_QArrayDataPointer<std::pair<double,_QVariant>_>.ptr;
      *pppVar1 = *pppVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
                super_QArrayDataPointer<std::pair<double,_QVariant>_>.size;
      *pqVar2 = *pqVar2 + 1;
    }
  }
  else {
    Inserter::Inserter(&IStack_88,(QArrayDataPointer<std::pair<double,_QVariant>_> *)this,i,n);
    Inserter::insertFill(&IStack_88,(pair<double,_QVariant> *)local_60,n);
    Inserter::~Inserter(&IStack_88);
  }
  ::QVariant::~QVariant((QVariant *)(local_60 + 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }